

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<double>::make_loo_norm(default_cost_type<double> *this,int n)

{
  double __x;
  bool bVar1;
  pointer __first;
  pointer pdVar2;
  double *pdVar3;
  type pdVar4;
  int local_24;
  int i;
  double div;
  int n_local;
  default_cost_type<double> *this_local;
  
  __first = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar2 = std::unique_ptr<double[],_std::default_delete<double[]>_>::get(&this->linear_elements);
  pdVar3 = std::max_element<double*>(__first,pdVar2 + n);
  __x = *pdVar3;
  bVar1 = std::isnormal(__x);
  if (bVar1) {
    for (local_24 = 0; local_24 != n; local_24 = local_24 + 1) {
      pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (&this->linear_elements,(long)local_24);
      *pdVar4 = *pdVar4 / __x;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }